

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v10::detail::write_escaped_string<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> str)

{
  size_t sVar1;
  anon_class_8_1_6971b95b_for_f f;
  buffer<char> *pbVar2;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_38;
  
  if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
    (*(code *)**(undefined8 **)this)(this,*(long *)(this + 0x10) + 1U,str.data_,str.size_);
  }
  f.result = *(find_escape_result<char> **)(this + 0x10);
  *(undefined1 **)(this + 0x10) = (undefined1 *)((long)&(f.result)->begin + 1);
  *(undefined1 *)((long)&(f.result)->begin + *(long *)(this + 8)) = 0x22;
  pbVar2 = (buffer<char> *)
           (str.data_ +
           (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  do {
    local_38.end = (char *)0x0;
    local_38.cp = 0;
    s.data_ = (char *)((long)pbVar2 -
                      (long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container);
    local_38.begin = (char *)pbVar2;
    if ((long)s.data_ < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                  ,0x178,"negative value");
    }
    s.size_ = (size_t)&local_38;
    for_each_codepoint<fmt::v10::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
              ((detail *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,s
               ,f);
    buffer<char>::append<char>
              ((buffer<char> *)this,
               (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
               local_38.begin);
    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_38.end;
  } while (((buffer<char> *)local_38.end != (buffer<char> *)0x0) &&
          (this = (detail *)write_escaped_cp<fmt::v10::appender,char>((appender)this,&local_38),
          out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
          (back_insert_iterator<fmt::v10::detail::buffer<char>_>)pbVar2));
  if (((buffer<char> *)this)->capacity_ < ((buffer<char> *)this)->size_ + 1) {
    (**((buffer<char> *)this)->_vptr_buffer)(this);
  }
  sVar1 = ((buffer<char> *)this)->size_;
  ((buffer<char> *)this)->size_ = sVar1 + 1;
  ((buffer<char> *)this)->ptr_[sVar1] = '\"';
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)this;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}